

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroupCollection::RevertAppendInternal(RowGroupCollection *this,idx_t start_row)

{
  bool bVar1;
  RowGroupSegmentTree *pRVar2;
  RowGroup *this_00;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *this_01;
  long lVar3;
  idx_t segment_index;
  SegmentLock l;
  idx_t local_30;
  unique_lock<std::mutex> local_28;
  
  LOCK();
  (this->total_rows).super___atomic_base<unsigned_long>._M_i = start_row;
  UNLOCK();
  this_01 = &this->row_groups;
  pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_01);
  local_28._M_device = &(pRVar2->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_01);
  lVar3 = (long)(pRVar2->super_SegmentTree<duckdb::RowGroup,_true>).nodes.
                super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                .
                super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pRVar2->super_SegmentTree<duckdb::RowGroup,_true>).nodes.
                super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                .
                super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_01);
    bVar1 = SegmentTree<duckdb::RowGroup,_true>::TryGetSegmentIndex
                      (&pRVar2->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_28,
                       start_row,&local_30);
    if (!bVar1) {
      local_30 = (lVar3 >> 4) - 1;
    }
    pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_01);
    this_00 = SegmentTree<duckdb::RowGroup,_true>::GetSegmentByIndex
                        (&pRVar2->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_28
                         ,local_30);
    pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_01);
    SegmentTree<duckdb::RowGroup,_true>::EraseSegments
              (&pRVar2->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_28,local_30)
    ;
    LOCK();
    (this_00->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    RowGroup::RevertAppend(this_00,start_row);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void RowGroupCollection::RevertAppendInternal(idx_t start_row) {
	total_rows = start_row;

	auto l = row_groups->Lock();
	idx_t segment_count = row_groups->GetSegmentCount(l);
	if (segment_count == 0) {
		// we have no segments to revert
		return;
	}
	idx_t segment_index;
	// find the segment index that the start row belongs to
	if (!row_groups->TryGetSegmentIndex(l, start_row, segment_index)) {
		// revert from the last segment
		segment_index = segment_count - 1;
	}
	auto &segment = *row_groups->GetSegmentByIndex(l, UnsafeNumericCast<int64_t>(segment_index));

	// remove any segments AFTER this segment: they should be deleted entirely
	row_groups->EraseSegments(l, segment_index);

	segment.next = nullptr;
	segment.RevertAppend(start_row);
}